

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_dimension_holders.h
# Opt level: O0

void __thiscall
Gudhi::persistence_matrix::Matrix_all_dimension_holder<int>::update_up
          (Matrix_all_dimension_holder<int> *this,uint dimension)

{
  size_type sVar1;
  reference pvVar2;
  value_type_conflict local_18;
  uint local_14;
  Matrix_all_dimension_holder<int> *pMStack_10;
  uint dimension_local;
  Matrix_all_dimension_holder<int> *this_local;
  
  local_14 = dimension;
  pMStack_10 = this;
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->dimensions_);
  if (sVar1 <= local_14) {
    local_18 = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->dimensions_,(ulong)(local_14 + 1),&local_18);
  }
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->dimensions_,(ulong)local_14);
  *pvVar2 = *pvVar2 + 1;
  sVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->dimensions_);
  this->maxDim_ = (int)sVar1 + -1;
  return;
}

Assistant:

void update_up(unsigned int dimension) {
    if (dimensions_.size() <= dimension) dimensions_.resize(dimension + 1, 0);
    ++(dimensions_[dimension]);
    maxDim_ = dimensions_.size() - 1;
  }